

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int * Gia_ManCreateMuxRefs(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  int v;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  
  iVar1 = p->nObjs;
  piVar2 = (int *)calloc((long)iVar1,4);
  v = 0;
  while( true ) {
    if (iVar1 <= v) {
      return piVar2;
    }
    pGVar3 = Gia_ManObj(p,v);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjRecognizeExor(pGVar3,&pFan0,&pFan1);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsMuxType(pGVar3), iVar1 != 0)) {
      pGVar3 = Gia_ObjRecognizeMux(pGVar3,&pFan0,&pFan1);
      iVar1 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe));
      piVar2[iVar1] = piVar2[iVar1] + 1;
    }
    v = v + 1;
    iVar1 = p->nObjs;
  }
  return piVar2;
}

Assistant:

int * Gia_ManCreateMuxRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj, * pCtrl, * pFan0, * pFan1;
    int i, * pMuxRefs;
    pMuxRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjRecognizeExor( pObj, &pFan0, &pFan1 ) )
            continue;
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pCtrl = Gia_ObjRecognizeMux( pObj, &pFan0, &pFan1 );
        pMuxRefs[ Gia_ObjId(p, Gia_Regular(pCtrl)) ]++;
    }
    return pMuxRefs;
}